

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::DiscMiIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  uint uVar8;
  undefined4 uVar9;
  RayHitK<8> *pRVar10;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float fVar19;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  float fVar24;
  undefined1 auVar21 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  Primitive *local_238;
  undefined1 *local_230;
  void *local_228;
  RTCRayQueryContext *local_220;
  RayHitK<8> *local_218;
  undefined1 (*local_210) [32];
  undefined4 local_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  float local_1d0 [4];
  float local_1c0 [4];
  float local_1b0 [8];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar11;
  undefined1 auVar37 [64];
  undefined1 auVar51 [64];
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[Disc->sharedGeomID].ptr;
  lVar13 = *(long *)&pGVar6->field_0x58;
  _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar14 = *(undefined1 (*) [16])(lVar13 + (Disc->primIDs).field_0.i[0] * _Var7);
  auVar40 = *(undefined1 (*) [16])(lVar13 + (Disc->primIDs).field_0.i[1] * _Var7);
  auVar34 = *(undefined1 (*) [16])(lVar13 + (Disc->primIDs).field_0.i[2] * _Var7);
  auVar33 = *(undefined1 (*) [16])(lVar13 + (Disc->primIDs).field_0.i[3] * _Var7);
  auVar16 = vunpcklps_avx(auVar14,auVar34);
  auVar21 = vunpckhps_avx(auVar14,auVar34);
  auVar14 = vunpcklps_avx(auVar40,auVar33);
  auVar41 = vunpckhps_avx(auVar40,auVar33);
  auVar33 = vunpcklps_avx(auVar16,auVar14);
  auVar40 = vunpckhps_avx(auVar16,auVar14);
  auVar35 = vunpcklps_avx(auVar21,auVar41);
  auVar14 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar34 = vpcmpgtd_avx(auVar14,_DAT_01f4ad30);
  local_190 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar9 = *(undefined4 *)(ray + k * 4);
  auVar20._4_4_ = uVar9;
  auVar20._0_4_ = uVar9;
  auVar20._8_4_ = uVar9;
  auVar20._12_4_ = uVar9;
  auVar33 = vsubps_avx(auVar33,auVar20);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar16._4_4_ = uVar9;
  auVar16._0_4_ = uVar9;
  auVar16._8_4_ = uVar9;
  auVar16._12_4_ = uVar9;
  auVar16 = vsubps_avx(auVar40,auVar16);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar14._4_4_ = uVar9;
  auVar14._0_4_ = uVar9;
  auVar14._8_4_ = uVar9;
  auVar14._12_4_ = uVar9;
  auVar35 = vsubps_avx(auVar35,auVar14);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar14 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar40 = vshufps_avx(auVar14,auVar14,0);
  auVar14 = vrcpps_avx(auVar40);
  fVar43 = auVar14._0_4_;
  auVar39._0_4_ = fVar43 * auVar40._0_4_;
  fVar45 = auVar14._4_4_;
  auVar39._4_4_ = fVar45 * auVar40._4_4_;
  fVar46 = auVar14._8_4_;
  auVar39._8_4_ = fVar46 * auVar40._8_4_;
  fVar47 = auVar14._12_4_;
  auVar39._12_4_ = fVar47 * auVar40._12_4_;
  auVar48._8_4_ = 0x3f800000;
  auVar48._0_8_ = 0x3f8000003f800000;
  auVar48._12_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar48,auVar39);
  fVar29 = auVar35._0_4_;
  fVar30 = auVar35._4_4_;
  fVar31 = auVar35._8_4_;
  fVar32 = auVar35._12_4_;
  fVar25 = auVar16._0_4_;
  fVar26 = auVar16._4_4_;
  fVar27 = auVar16._8_4_;
  fVar28 = auVar16._12_4_;
  fVar19 = auVar33._0_4_;
  fVar22 = auVar33._4_4_;
  fVar23 = auVar33._8_4_;
  fVar24 = auVar33._12_4_;
  local_1e0._0_4_ =
       (fVar19 * fVar1 + fVar25 * fVar2 + fVar29 * fVar3) * (fVar43 + fVar43 * auVar14._0_4_);
  local_1e0._4_4_ =
       (fVar22 * fVar1 + fVar26 * fVar2 + fVar30 * fVar3) * (fVar45 + fVar45 * auVar14._4_4_);
  local_1e0._8_4_ =
       (fVar23 * fVar1 + fVar27 * fVar2 + fVar31 * fVar3) * (fVar46 + fVar46 * auVar14._8_4_);
  local_1e0._12_4_ =
       (fVar24 * fVar1 + fVar28 * fVar2 + fVar32 * fVar3) * (fVar47 + fVar47 * auVar14._12_4_);
  auVar49 = ZEXT1664(local_1e0);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar40._4_4_ = uVar9;
  auVar40._0_4_ = uVar9;
  auVar40._8_4_ = uVar9;
  auVar40._12_4_ = uVar9;
  auVar14 = vcmpps_avx(auVar40,local_1e0,2);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar50._4_4_ = uVar9;
  auVar50._0_4_ = uVar9;
  auVar50._8_4_ = uVar9;
  auVar50._12_4_ = uVar9;
  auVar51 = ZEXT1664(auVar50);
  auVar40 = vcmpps_avx(local_1e0,auVar50,2);
  auVar14 = vandps_avx(auVar40,auVar14);
  auVar40 = auVar34 & auVar14;
  if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0') {
    auVar14 = vandps_avx(auVar14,auVar34);
    auVar21 = vunpckhps_avx(auVar21,auVar41);
    auVar34._0_4_ = local_1e0._0_4_ * fVar1;
    auVar34._4_4_ = local_1e0._4_4_ * fVar1;
    auVar34._8_4_ = local_1e0._8_4_ * fVar1;
    auVar34._12_4_ = local_1e0._12_4_ * fVar1;
    auVar41._0_4_ = local_1e0._0_4_ * fVar2;
    auVar41._4_4_ = local_1e0._4_4_ * fVar2;
    auVar41._8_4_ = local_1e0._8_4_ * fVar2;
    auVar41._12_4_ = local_1e0._12_4_ * fVar2;
    auVar44._0_4_ = local_1e0._0_4_ * fVar3;
    auVar44._4_4_ = local_1e0._4_4_ * fVar3;
    auVar44._8_4_ = local_1e0._8_4_ * fVar3;
    auVar44._12_4_ = local_1e0._12_4_ * fVar3;
    auVar40 = vsubps_avx(auVar33,auVar34);
    auVar34 = vsubps_avx(auVar16,auVar41);
    auVar33 = vsubps_avx(auVar35,auVar44);
    auVar35._0_4_ =
         auVar34._0_4_ * auVar34._0_4_ + auVar33._0_4_ * auVar33._0_4_ +
         auVar40._0_4_ * auVar40._0_4_;
    auVar35._4_4_ =
         auVar34._4_4_ * auVar34._4_4_ + auVar33._4_4_ * auVar33._4_4_ +
         auVar40._4_4_ * auVar40._4_4_;
    auVar35._8_4_ =
         auVar34._8_4_ * auVar34._8_4_ + auVar33._8_4_ * auVar33._8_4_ +
         auVar40._8_4_ * auVar40._8_4_;
    auVar35._12_4_ =
         auVar34._12_4_ * auVar34._12_4_ + auVar33._12_4_ * auVar33._12_4_ +
         auVar40._12_4_ * auVar40._12_4_;
    auVar33._0_4_ = auVar21._0_4_ * auVar21._0_4_;
    auVar33._4_4_ = auVar21._4_4_ * auVar21._4_4_;
    auVar33._8_4_ = auVar21._8_4_ * auVar21._8_4_;
    auVar33._12_4_ = auVar21._12_4_ * auVar21._12_4_;
    auVar40 = vcmpps_avx(auVar35,auVar33,2);
    auVar34 = auVar14 & auVar40;
    if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0')
    {
      auVar40 = vandps_avx(auVar14,auVar40);
      auVar21._0_4_ = fVar19 * fVar19 + fVar25 * fVar25 + fVar29 * fVar29;
      auVar21._4_4_ = fVar22 * fVar22 + fVar26 * fVar26 + fVar30 * fVar30;
      auVar21._8_4_ = fVar23 * fVar23 + fVar27 * fVar27 + fVar31 * fVar31;
      auVar21._12_4_ = fVar24 * fVar24 + fVar28 * fVar28 + fVar32 * fVar32;
      auVar34 = vcmpps_avx(auVar21,auVar33,6);
      auVar33 = auVar34 & auVar40;
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) {
        local_290 = vandps_avx(auVar40,auVar34);
        local_200 = ZEXT1632(ZEXT816(0));
        local_1d0[0] = -fVar1;
        local_1d0[1] = -fVar1;
        local_1d0[2] = -fVar1;
        local_1d0[3] = -fVar1;
        local_1c0[0] = -fVar2;
        local_1c0[1] = -fVar2;
        local_1c0[2] = -fVar2;
        local_1c0[3] = -fVar2;
        local_1b0[0] = -fVar3;
        local_1b0[1] = -fVar3;
        local_1b0[2] = -fVar3;
        local_1b0[3] = -fVar3;
        auVar36._8_4_ = 0x7f800000;
        auVar36._0_8_ = 0x7f8000007f800000;
        auVar36._12_4_ = 0x7f800000;
        auVar37 = ZEXT1664(auVar36);
        auVar40 = vblendvps_avx(auVar36,local_1e0,local_290);
        auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
        auVar34 = vminps_avx(auVar34,auVar40);
        auVar33 = vshufpd_avx(auVar34,auVar34,1);
        auVar34 = vminps_avx(auVar33,auVar34);
        auVar34 = vcmpps_avx(auVar40,auVar34,0);
        auVar33 = local_290 & auVar34;
        auVar40 = local_290;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar40 = vandps_avx(auVar34,local_290);
        }
        uVar8 = vmovmskps_avx(auVar40);
        uVar12 = 1 << ((byte)k & 0x1f);
        lVar13 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        auVar18 = vcmpps_avx(ZEXT1632(auVar14),ZEXT1632(auVar14),0xf);
        auVar38 = ZEXT3264(auVar18);
        auVar42 = ZEXT464(0) << 0x20;
        do {
          local_210 = &local_180;
          local_230 = local_280;
          uVar8 = *(uint *)(local_190 + lVar13 * 4);
          pRVar10 = (RayHitK<8> *)(ulong)uVar8;
          pGVar6 = (pSVar5->geometries).items[(long)pRVar10].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_290 + lVar13 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar9 = *(undefined4 *)(local_200 + lVar13 * 4);
              uVar4 = *(undefined4 *)(local_200 + lVar13 * 4 + 0x10);
              *(float *)(ray + k * 4 + 0x100) = local_1d0[lVar13 + -4];
              *(float *)(ray + k * 4 + 0x180) = local_1d0[lVar13];
              *(float *)(ray + k * 4 + 0x1a0) = local_1c0[lVar13];
              *(float *)(ray + k * 4 + 0x1c0) = local_1b0[lVar13];
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar9;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
              *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[lVar13];
              *(uint *)(ray + k * 4 + 0x240) = uVar8;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_200 + lVar13 * 4);
            local_100 = *(undefined4 *)(local_200 + lVar13 * 4 + 0x10);
            auStack_b0 = vpshufd_avx(ZEXT416(uVar8),0);
            local_e0 = (Disc->primIDs).field_0.i[lVar13];
            fVar1 = local_1d0[lVar13];
            local_180._4_4_ = fVar1;
            local_180._0_4_ = fVar1;
            local_180._8_4_ = fVar1;
            local_180._12_4_ = fVar1;
            local_180._16_4_ = fVar1;
            local_180._20_4_ = fVar1;
            local_180._24_4_ = fVar1;
            local_180._28_4_ = fVar1;
            fVar1 = local_1c0[lVar13];
            local_160._4_4_ = fVar1;
            local_160._0_4_ = fVar1;
            local_160._8_4_ = fVar1;
            local_160._12_4_ = fVar1;
            local_160._16_4_ = fVar1;
            local_160._20_4_ = fVar1;
            local_160._24_4_ = fVar1;
            local_160._28_4_ = fVar1;
            fVar1 = local_1b0[lVar13];
            local_140._4_4_ = fVar1;
            local_140._0_4_ = fVar1;
            local_140._8_4_ = fVar1;
            local_140._12_4_ = fVar1;
            local_140._16_4_ = fVar1;
            local_140._20_4_ = fVar1;
            local_140._24_4_ = fVar1;
            local_140._28_4_ = fVar1;
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            *(float *)(ray + k * 4 + 0x100) = local_1d0[lVar13 + -4];
            local_280 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar12 & 0xf) << 4));
            local_270 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar12 >> 4) * 0x10);
            local_228 = pGVar6->userPtr;
            local_220 = context->user;
            local_208 = 8;
            pRVar10 = (RayHitK<8> *)pGVar6->intersectionFilterN;
            local_218 = ray;
            if (pRVar10 != (RayHitK<8> *)0x0) {
              local_250 = auVar49._0_16_;
              local_260 = auVar51._0_16_;
              auVar18 = ZEXT1632(auVar38._0_16_);
              local_238 = Disc;
              pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_230);
              auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar18 = vcmpps_avx(auVar18,auVar18,0xf);
              auVar38 = ZEXT3264(auVar18);
              auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar51 = ZEXT1664(local_260);
              auVar49 = ZEXT1664(local_250);
              Disc = local_238;
            }
            auVar14 = vpcmpeqd_avx(auVar42._0_16_,local_280);
            auVar40 = vpcmpeqd_avx(auVar42._0_16_,local_270);
            auVar18._16_16_ = auVar40;
            auVar18._0_16_ = auVar14;
            auVar18 = auVar38._0_32_ & ~auVar18;
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar18 >> 0x7f,0) == '\0') &&
                  (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar18 >> 0xbf,0) == '\0') &&
                (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar18[0x1f]) {
              auVar15._0_4_ = auVar38._0_4_ ^ auVar14._0_4_;
              auVar15._4_4_ = auVar38._4_4_ ^ auVar14._4_4_;
              auVar15._8_4_ = auVar38._8_4_ ^ auVar14._8_4_;
              auVar15._12_4_ = auVar38._12_4_ ^ auVar14._12_4_;
              auVar15._16_4_ = auVar38._16_4_ ^ auVar40._0_4_;
              auVar15._20_4_ = auVar38._20_4_ ^ auVar40._4_4_;
              auVar15._24_4_ = auVar38._24_4_ ^ auVar40._8_4_;
              auVar15._28_4_ = auVar38._28_4_ ^ auVar40._12_4_;
            }
            else {
              pRVar10 = (RayHitK<8> *)context->args->filter;
              if ((pRVar10 != (RayHitK<8> *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                local_250 = auVar49._0_16_;
                local_260 = auVar51._0_16_;
                auVar18 = ZEXT1632(auVar38._0_16_);
                pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_230);
                auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar18 = vcmpps_avx(auVar18,auVar18,0xf);
                auVar38 = ZEXT3264(auVar18);
                auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar51 = ZEXT1664(local_260);
                auVar49 = ZEXT1664(local_250);
              }
              auVar14 = vpcmpeqd_avx(auVar42._0_16_,local_280);
              auVar40 = vpcmpeqd_avx(auVar42._0_16_,local_270);
              auVar17._16_16_ = auVar40;
              auVar17._0_16_ = auVar14;
              auVar15._0_4_ = auVar38._0_4_ ^ auVar14._0_4_;
              auVar15._4_4_ = auVar38._4_4_ ^ auVar14._4_4_;
              auVar15._8_4_ = auVar38._8_4_ ^ auVar14._8_4_;
              auVar15._12_4_ = auVar38._12_4_ ^ auVar14._12_4_;
              auVar15._16_4_ = auVar38._16_4_ ^ auVar40._0_4_;
              auVar15._20_4_ = auVar38._20_4_ ^ auVar40._4_4_;
              auVar15._24_4_ = auVar38._24_4_ ^ auVar40._8_4_;
              auVar15._28_4_ = auVar38._28_4_ ^ auVar40._12_4_;
              auVar18 = auVar38._0_32_ & ~auVar17;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                auVar18 = vmaskmovps_avx(auVar15,*local_210);
                *(undefined1 (*) [32])(local_218 + 0x180) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[1]);
                *(undefined1 (*) [32])(local_218 + 0x1a0) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[2]);
                *(undefined1 (*) [32])(local_218 + 0x1c0) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[3]);
                *(undefined1 (*) [32])(local_218 + 0x1e0) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[4]);
                *(undefined1 (*) [32])(local_218 + 0x200) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[5]);
                *(undefined1 (*) [32])(local_218 + 0x220) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[6]);
                *(undefined1 (*) [32])(local_218 + 0x240) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[7]);
                *(undefined1 (*) [32])(local_218 + 0x260) = auVar18;
                auVar18 = vmaskmovps_avx(auVar15,local_210[8]);
                *(undefined1 (*) [32])(local_218 + 0x280) = auVar18;
                pRVar10 = local_218;
              }
            }
            if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar15 >> 0x7f,0) == '\0') &&
                  (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0xbf,0) == '\0') &&
                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar15[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = auVar51._0_4_;
            }
            else {
              auVar51 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_290 + lVar13 * 4) = 0;
            auVar14 = vshufps_avx(auVar51._0_16_,auVar51._0_16_,0);
            auVar14 = vcmpps_avx(auVar49._0_16_,auVar14,2);
            local_290 = vandps_avx(auVar14,local_290);
          }
          if ((((local_290 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_290 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_290 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_290[0xf]) {
            return;
          }
          auVar14 = vblendvps_avx(auVar37._0_16_,auVar49._0_16_,local_290);
          auVar40 = vshufps_avx(auVar14,auVar14,0xb1);
          auVar40 = vminps_avx(auVar40,auVar14);
          auVar34 = vshufpd_avx(auVar40,auVar40,1);
          auVar40 = vminps_avx(auVar34,auVar40);
          auVar40 = vcmpps_avx(auVar14,auVar40,0);
          auVar34 = local_290 & auVar40;
          auVar14 = local_290;
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar34[0xf] < '\0') {
            auVar14 = vandps_avx(auVar40,local_290);
          }
          uVar9 = vmovmskps_avx(auVar14);
          uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
          lVar13 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }